

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O1

void __thiscall
duckdb::StrfTimeFormat::AddFormatSpecifier
          (StrfTimeFormat *this,string *preceding_literal,StrTimeSpecifier specifier)

{
  idx_t *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  iterator __position;
  StrTimeSpecifier SVar3;
  idx_t iVar4;
  StrTimeSpecifier local_41;
  string local_40;
  
  local_41 = specifier;
  ::std::vector<bool,_std::allocator<bool>_>::push_back
            (&(this->is_date_specifier).super_vector<bool,_std::allocator<bool>_>,
             (bool)((byte)(0xe1e000007 >> (specifier & (NANOSECOND_PADDED|LOCALE_APPROPRIATE_TIME)))
                   & specifier < (NANOSECOND_PADDED|DAY_OF_MONTH)));
  SVar3 = local_41;
  iVar4 = StrfTimepecifierSize(local_41);
  if (iVar4 == 0) {
    __position._M_current =
         (this->var_length_specifiers).
         super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
         super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->var_length_specifiers).
        super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
        super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<duckdb::StrTimeSpecifier,std::allocator<duckdb::StrTimeSpecifier>>::
      _M_realloc_insert<duckdb::StrTimeSpecifier_const&>
                ((vector<duckdb::StrTimeSpecifier,std::allocator<duckdb::StrTimeSpecifier>> *)
                 &this->var_length_specifiers,__position,&local_41);
    }
    else {
      *__position._M_current = SVar3;
      (this->var_length_specifiers).
      super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
      super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
      _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  else {
    piVar1 = &(this->super_StrTimeFormat).constant_size;
    *piVar1 = *piVar1 + iVar4;
  }
  local_40._M_dataplus._M_p = (preceding_literal->_M_dataplus)._M_p;
  paVar2 = &preceding_literal->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p == paVar2) {
    local_40.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_40.field_2._8_8_ = *(undefined8 *)((long)&preceding_literal->field_2 + 8);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  }
  else {
    local_40.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_40._M_string_length = preceding_literal->_M_string_length;
  (preceding_literal->_M_dataplus)._M_p = (pointer)paVar2;
  preceding_literal->_M_string_length = 0;
  (preceding_literal->field_2)._M_local_buf[0] = '\0';
  StrTimeFormat::AddFormatSpecifier(&this->super_StrTimeFormat,&local_40,local_41);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void StrfTimeFormat::AddFormatSpecifier(string preceding_literal, StrTimeSpecifier specifier) {
	is_date_specifier.push_back(IsDateSpecifier(specifier));
	idx_t specifier_size = StrfTimepecifierSize(specifier);
	if (specifier_size == 0) {
		// variable length specifier
		var_length_specifiers.push_back(specifier);
	} else {
		// constant size specifier
		constant_size += specifier_size;
	}
	StrTimeFormat::AddFormatSpecifier(std::move(preceding_literal), specifier);
}